

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString __thiscall SimpleString::subString(SimpleString *this,size_t beginPos,size_t amount)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar4;
  SimpleString SVar5;
  
  uVar3 = 0xfffffffffffffffe;
  do {
    pcVar1 = (char *)(*(long *)beginPos + 2 + uVar3);
    uVar3 = uVar3 + 1;
  } while (*pcVar1 != '\0');
  if (uVar3 < amount) {
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
    copyBufferToNewInternalBuffer(this,"");
    sVar4 = extraout_RDX;
  }
  else {
    SimpleString(this,(char *)(*(long *)beginPos + amount));
    uVar3 = 0xffffffffffffffff;
    do {
      lVar2 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (this->buffer_[lVar2] != '\0');
    sVar4 = extraout_RDX_00;
    if (in_RCX < uVar3) {
      this->buffer_[in_RCX] = '\0';
    }
  }
  SVar5.bufferSize_ = sVar4;
  SVar5.buffer_ = (char *)this;
  return SVar5;
}

Assistant:

SimpleString SimpleString::subString(size_t beginPos, size_t amount) const
{
    if (beginPos > size()-1) return "";

    SimpleString newString = getBuffer() + beginPos;

    if (newString.size() > amount)
        newString.buffer_[amount] = '\0';

    return newString;
}